

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_base.cpp
# Opt level: O0

void __thiscall
zmq::socket_base_t::monitor_event
          (socket_base_t *this,uint64_t event_,uint64_t *values_,uint64_t values_count_,
          endpoint_uri_pair_t *endpoint_uri_pair_)

{
  ulong uVar1;
  unsigned_short uVar2;
  uint uVar3;
  undefined2 *puVar4;
  void *__src;
  ulong *puVar5;
  void *pvVar6;
  zmq_msg_t *msg_;
  size_t sVar7;
  zmq_msg_t *msg__00;
  ulong in_RCX;
  ulong *in_RDX;
  ulong in_RSI;
  long in_RDI;
  endpoint_uri_pair_t *in_R8;
  uint64_t i;
  string *endpoint_uri;
  uint8_t *data;
  uint32_t value;
  uint16_t event;
  zmq_msg_t msg;
  size_t in_stack_ffffffffffffff28;
  int iVar8;
  zmq_msg_t *in_stack_ffffffffffffff30;
  zmq_msg_t *in_stack_ffffffffffffff38;
  ulong local_88;
  
  if (*(long *)(in_RDI + 0x670) != 0) {
    if (*(int *)(in_RDI + 0x440) == 1) {
      uVar2 = std::numeric_limits<unsigned_short>::max();
      if (uVar2 < in_RSI) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                "event_ <= std::numeric_limits<uint16_t>::max ()",
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socket_base.cpp"
                ,0x7bc);
        fflush(_stderr);
        zmq_abort((char *)0x2065b6);
      }
      if (in_RCX != 1) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","values_count_ == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socket_base.cpp"
                ,0x7be);
        fflush(_stderr);
        zmq_abort((char *)0x206615);
      }
      uVar1 = *in_RDX;
      uVar3 = std::numeric_limits<unsigned_int>::max();
      if (uVar3 < uVar1) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                "values_[0] <= std::numeric_limits<uint32_t>::max ()",
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socket_base.cpp"
                ,0x7c0);
        fflush(_stderr);
        zmq_abort((char *)0x20668c);
      }
      uVar1 = *in_RDX;
      zmq_msg_init_size(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      puVar4 = (undefined2 *)zmq_msg_data((zmq_msg_t *)0x2066c3);
      *puVar4 = (short)in_RSI;
      *(int *)(puVar4 + 1) = (int)uVar1;
      zmq_msg_send(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                   (int)(in_stack_ffffffffffffff28 >> 0x20));
      endpoint_uri_pair_t::identifier_abi_cxx11_(in_R8);
      std::__cxx11::string::size();
      zmq_msg_init_size(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      iVar8 = (int)(in_stack_ffffffffffffff28 >> 0x20);
      pvVar6 = zmq_msg_data((zmq_msg_t *)0x206732);
      __src = (void *)std::__cxx11::string::c_str();
      sVar7 = std::__cxx11::string::size();
      memcpy(pvVar6,__src,sVar7);
      zmq_msg_send(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,iVar8);
    }
    else if (*(int *)(in_RDI + 0x440) == 2) {
      zmq_msg_init_size(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      puVar5 = (ulong *)zmq_msg_data((zmq_msg_t *)0x206798);
      *puVar5 = in_RSI;
      zmq_msg_send(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                   (int)(in_stack_ffffffffffffff28 >> 0x20));
      zmq_msg_init_size(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      puVar5 = (ulong *)zmq_msg_data((zmq_msg_t *)0x2067da);
      *puVar5 = in_RCX;
      zmq_msg_send(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                   (int)(in_stack_ffffffffffffff28 >> 0x20));
      for (local_88 = 0; local_88 < in_RCX; local_88 = local_88 + 1) {
        zmq_msg_init_size(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        puVar5 = (ulong *)zmq_msg_data((zmq_msg_t *)0x206834);
        *puVar5 = in_RDX[local_88];
        zmq_msg_send(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                     (int)(in_stack_ffffffffffffff28 >> 0x20));
      }
      std::__cxx11::string::size();
      zmq_msg_init_size(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      pvVar6 = zmq_msg_data((zmq_msg_t *)0x20689a);
      msg_ = (zmq_msg_t *)std::__cxx11::string::c_str();
      sVar7 = std::__cxx11::string::size();
      memcpy(pvVar6,msg_,sVar7);
      zmq_msg_send(in_stack_ffffffffffffff38,msg_,(int)((ulong)pvVar6 >> 0x20));
      std::__cxx11::string::size();
      zmq_msg_init_size(msg_,(size_t)pvVar6);
      iVar8 = (int)((ulong)pvVar6 >> 0x20);
      msg__00 = (zmq_msg_t *)zmq_msg_data((zmq_msg_t *)0x206911);
      pvVar6 = (void *)std::__cxx11::string::c_str();
      sVar7 = std::__cxx11::string::size();
      memcpy(msg__00,pvVar6,sVar7);
      zmq_msg_send(msg__00,msg_,iVar8);
    }
  }
  return;
}

Assistant:

void zmq::socket_base_t::monitor_event (
  uint64_t event_,
  const uint64_t values_[],
  uint64_t values_count_,
  const endpoint_uri_pair_t &endpoint_uri_pair_) const
{
    // this is a private method which is only called from
    // contexts where the _monitor_sync mutex has been locked before

    if (_monitor_socket) {
        zmq_msg_t msg;

        switch (options.monitor_event_version) {
            case 1: {
                //  The API should not allow to activate unsupported events
                zmq_assert (event_ <= std::numeric_limits<uint16_t>::max ());
                //  v1 only allows one value
                zmq_assert (values_count_ == 1);
                zmq_assert (values_[0]
                            <= std::numeric_limits<uint32_t>::max ());

                //  Send event and value in first frame
                const uint16_t event = static_cast<uint16_t> (event_);
                const uint32_t value = static_cast<uint32_t> (values_[0]);
                zmq_msg_init_size (&msg, sizeof (event) + sizeof (value));
                uint8_t *data = static_cast<uint8_t *> (zmq_msg_data (&msg));
                //  Avoid dereferencing uint32_t on unaligned address
                memcpy (data + 0, &event, sizeof (event));
                memcpy (data + sizeof (event), &value, sizeof (value));
                zmq_msg_send (&msg, _monitor_socket, ZMQ_SNDMORE);

                const std::string &endpoint_uri =
                  endpoint_uri_pair_.identifier ();

                //  Send address in second frame
                zmq_msg_init_size (&msg, endpoint_uri.size ());
                memcpy (zmq_msg_data (&msg), endpoint_uri.c_str (),
                        endpoint_uri.size ());
                zmq_msg_send (&msg, _monitor_socket, 0);
            } break;
            case 2: {
                //  Send event in first frame (64bit unsigned)
                zmq_msg_init_size (&msg, sizeof (event_));
                memcpy (zmq_msg_data (&msg), &event_, sizeof (event_));
                zmq_msg_send (&msg, _monitor_socket, ZMQ_SNDMORE);

                //  Send number of values that will follow in second frame
                zmq_msg_init_size (&msg, sizeof (values_count_));
                memcpy (zmq_msg_data (&msg), &values_count_,
                        sizeof (values_count_));
                zmq_msg_send (&msg, _monitor_socket, ZMQ_SNDMORE);

                //  Send values in third-Nth frames (64bit unsigned)
                for (uint64_t i = 0; i < values_count_; ++i) {
                    zmq_msg_init_size (&msg, sizeof (values_[i]));
                    memcpy (zmq_msg_data (&msg), &values_[i],
                            sizeof (values_[i]));
                    zmq_msg_send (&msg, _monitor_socket, ZMQ_SNDMORE);
                }

                //  Send local endpoint URI in second-to-last frame (string)
                zmq_msg_init_size (&msg, endpoint_uri_pair_.local.size ());
                memcpy (zmq_msg_data (&msg), endpoint_uri_pair_.local.c_str (),
                        endpoint_uri_pair_.local.size ());
                zmq_msg_send (&msg, _monitor_socket, ZMQ_SNDMORE);

                //  Send remote endpoint URI in last frame (string)
                zmq_msg_init_size (&msg, endpoint_uri_pair_.remote.size ());
                memcpy (zmq_msg_data (&msg), endpoint_uri_pair_.remote.c_str (),
                        endpoint_uri_pair_.remote.size ());
                zmq_msg_send (&msg, _monitor_socket, 0);
            } break;
        }
    }
}